

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Progress.cpp
# Opt level: O3

void __thiscall Progress::renderStyleMono(Progress *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long lVar3;
  size_type sVar4;
  int iVar5;
  time_t tVar6;
  ostream *poVar7;
  long lVar8;
  string *psVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  Progress *in_RSI;
  uint uVar13;
  double dVar14;
  string estimate_time;
  string elapsed_time;
  string local_90;
  string local_70;
  char *local_50;
  long local_48;
  char local_40;
  undefined7 uStack_3f;
  
  lVar8 = this->current;
  lVar2 = this->minimum;
  lVar3 = this->maximum;
  tVar6 = time((time_t *)0x0);
  local_50 = &local_40;
  local_48 = 0;
  local_40 = '\0';
  if ((this->elapsed == true) && (this->start != 0)) {
    formatTime_abi_cxx11_(&local_90,in_RSI,tVar6 - this->start);
    in_RSI = (Progress *)&local_90;
    std::__cxx11::string::operator=((string *)&local_50,(string *)in_RSI);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      in_RSI = (Progress *)
               (CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                         local_90.field_2._M_local_buf[0]) + 1);
      operator_delete(local_90._M_dataplus._M_p,(ulong)in_RSI);
    }
  }
  dVar14 = (double)(lVar8 - lVar2) / (double)(lVar3 - lVar2);
  paVar1 = &local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)paVar1;
  if ((this->estimate == true) && (this->start != 0)) {
    if (1e-06 <= dVar14) {
      formatTime_abi_cxx11_
                (&local_70,in_RSI,
                 (long)(int)(((1.0 - dVar14) * (double)(tVar6 - this->start)) / dVar14));
    }
    else {
      formatTime_abi_cxx11_(&local_70,in_RSI,0);
    }
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_) !=
        &local_70.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_),
                      local_70.field_2._M_allocated_capacity + 1);
    }
  }
  sVar4 = (this->label)._M_string_length;
  iVar11 = -6;
  if (this->percentage == false) {
    iVar11 = -1;
  }
  iVar10 = (int)sVar4;
  if (sVar4 == 0) {
    iVar10 = -1;
  }
  iVar12 = -1;
  if (this->elapsed != false) {
    iVar12 = (int)local_48;
  }
  iVar5 = -1;
  if (this->estimate != false) {
    iVar5 = (int)local_90._M_string_length;
  }
  iVar11 = ((iVar11 + this->width) - (iVar10 + iVar12 + iVar5)) + -2;
  if (0 < iVar11) {
    if (sVar4 != 0) {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(this->label)._M_dataplus._M_p,sVar4);
      local_70._M_dataplus._M_p._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_70,1);
    }
    uVar13 = (uint)((double)iVar11 * dVar14);
    if (0 < (int)uVar13) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[47m",5);
      lVar8 = *(long *)(std::cout + -0x18);
      if (*(char *)(lVar8 + 0x10a1d1) == '\0') {
        std::ios::widen((char)lVar8 + -0x10);
        *(undefined1 *)(lVar8 + 0x10a1d1) = 1;
      }
      lVar2 = std::cout;
      *(undefined1 *)(lVar8 + 0x10a1d0) = 0x20;
      *(ulong *)(ioctl + *(long *)(lVar2 + -0x18)) = (ulong)uVar13;
      local_70._M_dataplus._M_p._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_70,1);
    }
    if (iVar11 - uVar13 != 0 && (int)uVar13 <= iVar11) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[40m",5);
      lVar8 = *(long *)(std::cout + -0x18);
      if (*(char *)(lVar8 + 0x10a1d1) == '\0') {
        std::ios::widen((char)lVar8 + -0x10);
        *(undefined1 *)(lVar8 + 0x10a1d1) = 1;
      }
      lVar2 = std::cout;
      *(undefined1 *)(lVar8 + 0x10a1d0) = 0x20;
      *(ulong *)(ioctl + *(long *)(lVar2 + -0x18)) = (ulong)(iVar11 - uVar13);
      local_70._M_dataplus._M_p._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_70,1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[0m",4);
    if (this->percentage == true) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      lVar8 = *(long *)(std::cout + -0x18);
      if (*(char *)(lVar8 + 0x10a1d1) == '\0') {
        std::ios::widen((char)lVar8 + -0x10);
        *(undefined1 *)(lVar8 + 0x10a1d1) = 1;
      }
      lVar2 = std::cout;
      *(undefined1 *)(lVar8 + 0x10a1d0) = 0x20;
      *(undefined8 *)(ioctl + *(long *)(lVar2 + -0x18)) = 3;
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)(dVar14 * 100.0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"%",1);
    }
    lVar8 = this->start;
    if ((lVar8 != 0 & this->elapsed) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_50,local_48);
      lVar8 = this->start;
    }
    if ((this->estimate == true) && (lVar8 != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,local_90._M_dataplus._M_p,local_90._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\r",1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    return;
  }
  psVar9 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar9 = psVar9 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>(psVar9,"The specified width is insufficient.","");
  __cxa_throw(psVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void Progress::renderStyleMono ()
{
  // Fraction completed.
  double fraction = (1.0 * (current - minimum)) / (maximum - minimum);

  // Elapsed time.
  time_t now = time (NULL);
  std::string elapsed_time;
  if (elapsed && start != 0)
    elapsed_time = formatTime (now - start);

  // Estimated remaining time.
  std::string estimate_time;
  if (estimate && start != 0)
  {
    if (fraction >= 1e-6)
      estimate_time = formatTime ((time_t) (int) (((now - start) * (1.0 - fraction)) / fraction));
    else
      estimate_time = formatTime (0);
  }

  // Calculate bar width.
  int bar = width
          - (label.length () ? label.length () + 1         : 0)
          - (percentage      ? 5                           : 0)
          - (elapsed         ? elapsed_time.length () + 1  : 0)
          - (estimate        ? estimate_time.length () + 1 : 0);

  if (bar < 1)
    throw std::string ("The specified width is insufficient.");

  int visible = (int) (fraction * bar);

  // Render.
  if (label.length ())
    std::cout << label
              << ' ';

  if (visible > 0)
    std::cout << "\033[47m" // White
              << std::setfill (' ')
              << std::setw (visible)
              << ' ';

  if (bar - visible > 0)
    std::cout << "\033[40m" // Black
              << std::setfill (' ')
              << std::setw (bar - visible)
              << ' ';

  std::cout << "\033[0m";

  if (percentage)
    std::cout << " "
              << std::setfill (' ')
              << std::setw (3)
              << (int) (fraction * 100)
              << "%";

  if (elapsed && start != 0)
    std::cout << " "
              << elapsed_time;

  if (estimate && start != 0)
    std::cout << " "
              << estimate_time;

  std::cout << "\r"
            << std::flush;
}